

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O0

ctmbstr tidyOptGetDefault(TidyOption topt)

{
  TidyOptionImpl *pTVar1;
  TidyOptionImpl *newopt;
  TidyOptionImpl *option;
  TidyOption topt_local;
  
  if ((topt == (TidyOption)0x0) || (topt->_opaque != 0xd)) {
    if ((topt == (TidyOption)0x0) || (topt[4]._opaque != 0)) {
      topt_local = (TidyOption)0x0;
    }
    else {
      topt_local = *(TidyOption *)(topt + 0xc);
    }
  }
  else {
    pTVar1 = prvTidygetOption(TidyDoctypeMode);
    topt_local = (TidyOption)prvTidyGetPickListLabelForPick(TidyDoctypeMode,(uint)pTVar1->dflt);
  }
  return (ctmbstr)topt_local;
}

Assistant:

ctmbstr TIDY_CALL       tidyOptGetDefault( TidyOption topt )
{
    const TidyOptionImpl* option = tidyOptionToImpl( topt );
    /* Special case for TidyDoctype, because it is declared as string */
    if ( option && option->id == TidyDoctype )
    {
        const TidyOptionImpl* newopt = TY_(getOption)( TidyDoctypeMode );
        return TY_(GetPickListLabelForPick)( TidyDoctypeMode, newopt->dflt );
    }
    if ( option && option->type == TidyString )
        return option->pdflt; /* Issue #306 - fix an old typo hidden by a cast! */
    return NULL;
}